

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkSamplerCreateInfo *sampler,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  Data *pDVar1;
  bool bVar2;
  SizeType SVar3;
  Value nexts;
  Data local_d8;
  Data local_c8;
  Data *local_b8;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_c8.n.i64 = (Number)0x0;
  local_c8.s.str = (Ch *)0x3000000000000;
  local_d8._4_1_ = '\0';
  local_d8._5_1_ = '\0';
  local_d8._6_1_ = '\0';
  local_d8._7_1_ = '\0';
  local_d8._0_4_ = sampler->flags;
  nexts.data_.s.str = (Ch *)0x405000000153d8f;
  nexts.data_.n = (Number)0x5;
  local_d8.s.str = (Ch *)((ulong)(-1 < (int)sampler->flags) << 0x35 | 0x1d6000000000000);
  local_b8 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_40.s = "minFilter";
  local_40.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFilter>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_c8.s,&local_40,sampler->minFilter,alloc);
  local_50.s = "magFilter";
  local_50.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFilter>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_c8.s,&local_50,sampler->magFilter,alloc);
  local_d8.n = (Number)(double)sampler->maxAnisotropy;
  nexts.data_.s.str = (Ch *)0x405000000153f1e;
  nexts.data_.n = (Number)0xd;
  local_d8.s.str = (Ch *)0x216000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_60.s = "compareOp";
  local_60.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkCompareOp>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_60,sampler->compareOp,alloc);
  local_d8._4_1_ = '\0';
  local_d8._5_1_ = '\0';
  local_d8._6_1_ = '\0';
  local_d8._7_1_ = '\0';
  local_d8._0_4_ = sampler->anisotropyEnable;
  nexts.data_.s.str = (Ch *)0x405000000153ed5;
  nexts.data_.n = (Number)0x10;
  local_d8.s.str = (Ch *)((ulong)(-1 < (int)sampler->anisotropyEnable) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_70.s = "mipmapMode";
  local_70.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerMipmapMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_70,sampler->mipmapMode,alloc);
  local_80.s = "addressModeU";
  SVar3 = 0xc;
  local_80.length = SVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_80,sampler->addressModeU,alloc);
  local_90.s = "addressModeV";
  local_90.length = SVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_90,sampler->addressModeV,alloc);
  local_a0.s = "addressModeW";
  local_a0.length = SVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerAddressMode>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_a0,sampler->addressModeW,alloc);
  local_b0.s = "borderColor";
  local_b0.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkBorderColor>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_b0,sampler->borderColor,alloc);
  local_d8._4_1_ = '\0';
  local_d8._5_1_ = '\0';
  local_d8._6_1_ = '\0';
  local_d8._7_1_ = '\0';
  local_d8._0_4_ = sampler->unnormalizedCoordinates;
  nexts.data_.s.str = (Ch *)0x405000000153f50;
  nexts.data_.n = (Number)0x17;
  local_d8.s.str =
       (Ch *)((ulong)(-1 < (int)sampler->unnormalizedCoordinates) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_d8._4_1_ = '\0';
  local_d8._5_1_ = '\0';
  local_d8._6_1_ = '\0';
  local_d8._7_1_ = '\0';
  local_d8._0_4_ = sampler->compareEnable;
  nexts.data_.s.str = (Ch *)0x405000000153ef2;
  nexts.data_.n = (Number)0xd;
  local_d8.s.str = (Ch *)((ulong)(-1 < (int)sampler->compareEnable) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_d8.n = (Number)(double)sampler->mipLodBias;
  nexts.data_.s.str = (Ch *)0x405000000153f45;
  nexts.data_.n = (Number)0xa;
  local_d8.s.str = (Ch *)0x216000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_d8.n = (Number)(double)sampler->minLod;
  nexts.data_.s.str = (Ch *)0x405000000153f3e;
  nexts.data_.n = (Number)0x6;
  local_d8.s.str = (Ch *)0x216000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_d8.n = (Number)(double)sampler->maxLod;
  nexts.data_.s.str = (Ch *)0x405000000153f37;
  nexts.data_.n = (Number)0x6;
  local_d8.s.str = (Ch *)0x216000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  pDVar1 = local_b8;
  if (sampler->pNext != (void *)0x0) {
    nexts.data_.n = (Number)0x0;
    nexts.data_.s.str = (Ch *)0x0;
    bVar2 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (sampler->pNext,alloc,&nexts,(DynamicStateInfo *)0x0);
    if (!bVar2) {
      return false;
    }
    local_d8.s.str = (Ch *)0x405000000153e45;
    local_d8.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_d8.s,&nexts,alloc);
  }
  if (&local_c8 != pDVar1) {
    pDVar1->n = local_c8.n;
    (&pDVar1->n)[1] = (Number)local_c8.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkSamplerCreateInfo& sampler, Allocator& alloc, Value *out_value)
{
	Value s(kObjectType);
	s.AddMember("flags", sampler.flags, alloc);
	s.AddMember("minFilter", sampler.minFilter, alloc);
	s.AddMember("magFilter", sampler.magFilter, alloc);
	s.AddMember("maxAnisotropy", sampler.maxAnisotropy, alloc);
	s.AddMember("compareOp", sampler.compareOp, alloc);
	s.AddMember("anisotropyEnable", sampler.anisotropyEnable, alloc);
	s.AddMember("mipmapMode", sampler.mipmapMode, alloc);
	s.AddMember("addressModeU", sampler.addressModeU, alloc);
	s.AddMember("addressModeV", sampler.addressModeV, alloc);
	s.AddMember("addressModeW", sampler.addressModeW, alloc);
	s.AddMember("borderColor", sampler.borderColor, alloc);
	s.AddMember("unnormalizedCoordinates", sampler.unnormalizedCoordinates, alloc);
	s.AddMember("compareEnable", sampler.compareEnable, alloc);
	s.AddMember("mipLodBias", sampler.mipLodBias, alloc);
	s.AddMember("minLod", sampler.minLod, alloc);
	s.AddMember("maxLod", sampler.maxLod, alloc);

	if (!pnext_chain_add_json_value(s, sampler, alloc, nullptr))
		return false;

	*out_value = s;
	return true;
}